

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_elements_address.cpp
# Opt level: O3

void __thiscall
ElementsAddressFactory_Constructor_Test::TestBody(ElementsAddressFactory_Constructor_Test *this)

{
  bool bVar1;
  ElementsAddressFactory factory;
  AssertHelper AStack_38;
  ElementsAddressFactory local_30;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::ElementsAddressFactory::ElementsAddressFactory(&local_30);
      local_30.super_AddressFactory._vptr_AddressFactory =
           (_func_int **)&PTR__AddressFactory_007215c8;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector(&local_30.super_AddressFactory.prefix_list_);
    }
  }
  else {
    testing::Message::Message((Message *)&local_30);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_elements_address.cpp"
               ,0x1d,
               "Expected: ElementsAddressFactory factory doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&AStack_38,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&AStack_38);
    if (local_30.super_AddressFactory._vptr_AddressFactory != (_func_int **)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && (local_30.super_AddressFactory._vptr_AddressFactory != (_func_int **)0x0)) {
        (**(code **)(*local_30.super_AddressFactory._vptr_AddressFactory + 8))();
      }
    }
  }
  return;
}

Assistant:

TEST(ElementsAddressFactory, Constructor)
{
  EXPECT_NO_THROW(ElementsAddressFactory factory);
}